

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

xmlURIPtr xmlParseURI(char *str)

{
  int iVar1;
  int ret;
  xmlURIPtr uri;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    str_local = (char *)xmlCreateURI();
    if (((xmlURIPtr)str_local != (xmlURIPtr)0x0) &&
       (iVar1 = xmlParse3986URIReference((xmlURIPtr)str_local,str), iVar1 != 0)) {
      xmlFreeURI((xmlURIPtr)str_local);
      str_local = (char *)0x0;
    }
  }
  return (xmlURIPtr)str_local;
}

Assistant:

xmlURIPtr
xmlParseURI(const char *str) {
    xmlURIPtr uri;
    int ret;

    if (str == NULL)
	return(NULL);
    uri = xmlCreateURI();
    if (uri != NULL) {
	ret = xmlParse3986URIReference(uri, str);
        if (ret) {
	    xmlFreeURI(uri);
	    return(NULL);
	}
    }
    return(uri);
}